

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void object_suite::fail_one_mismatched(void)

{
  bool bVar1;
  error_code eVar2;
  char input [12];
  reader reader;
  uint local_18c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168,"{\"alpha\":1]",0xc);
  local_188._M_dataplus._M_p = (pointer)strlen(local_168);
  local_188._M_string_length = (size_type)local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_188);
  local_188._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_18c = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x38d,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
  if ((long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_188._M_dataplus._M_p =
         (pointer)(((long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) + -1);
    local_18c = 1;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
              ("reader.level()","1",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x38e,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
    bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
    local_188._M_dataplus._M_p._0_1_ = bVar1;
    local_18c = CONCAT31(local_18c._1_3_,1);
    boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
              ("reader.next()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x38f,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
    local_188._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
    local_18c = 0xb;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
              ("reader.code()","token::code::key",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x390,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
    trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>(&local_188,&local_158);
    boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
              ("reader.value<std::string>()","\"alpha\"",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x391,"void object_suite::fail_one_mismatched()",&local_188,"alpha");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_158.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      local_188._M_dataplus._M_p =
           (pointer)(((long)local_158.stack.c.
                            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_158.stack.c.
                            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) + -1);
      local_18c = 1;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                ("reader.level()","1",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x392,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
      bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
      local_188._M_dataplus._M_p._0_1_ = bVar1;
      local_18c = CONCAT31(local_18c._1_3_,1);
      boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                ("reader.next()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x393,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
      local_18c = 8;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                ("reader.code()","token::code::integer",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x394,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
      local_188._M_dataplus._M_p._0_4_ =
           trial::protocol::json::basic_reader<char>::value<int>(&local_158);
      local_18c = 1;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
                ("reader.value<int>()","1",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x395,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
      if ((long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_158.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        local_188._M_dataplus._M_p =
             (pointer)(((long)local_158.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_158.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) + -1);
        local_18c = 1;
        boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                  ("reader.level()","1",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x396,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
        bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
        local_188._M_dataplus._M_p._0_1_ = bVar1;
        local_18c = local_18c & 0xffffff00;
        boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                  ("reader.next()","false",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x397,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
        local_18c = 0xfffffff8;
        boost::detail::
        test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                  ("reader.code()","token::code::error_expected_end_object",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x398,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
        eVar2 = trial::protocol::json::detail::basic_decoder<char>::error(&local_158.decoder);
        local_188._M_string_length = (size_type)eVar2._M_cat;
        local_188._M_dataplus._M_p._0_4_ = eVar2._M_value;
        local_18c = 8;
        boost::detail::
        test_with_impl<boost::detail::lw_test_eq,std::error_code,trial::protocol::json::errc>
                  ("reader.error()","json::expected_end_object",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x399,"void object_suite::fail_one_mismatched()",&local_188,&local_18c);
        if (local_158.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_158.stack.c.
                                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.stack.c.
                                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
    }
  }
  __assert_fail("stack.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/json/detail/reader.ipp"
                ,0x107,
                "size_type trial::protocol::json::basic_reader<char>::level() const [CharT = char]")
  ;
}

Assistant:

void fail_one_mismatched()
{
    const char input[] = "{\"alpha\":1]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_expected_end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.error(), json::expected_end_object);
}